

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsATimes(void *cvode_mem,N_Vector v,N_Vector z)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_30;
  CVodeMem local_28;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"cvLsATimes",&local_28,&local_30);
  if (iVar1 == 0) {
    iVar1 = (*local_30->jtimes)(v,z,local_28->cv_tn,local_30->ycur,local_30->fcur,local_30->jt_data,
                                local_30->ytemp);
    local_30->njtimes = local_30->njtimes + 1;
    if (iVar1 == 0) {
      N_VLinearSum(0x3ff0000000000000,-local_28->cv_gamma,v,z,z);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int cvLsATimes(void* cvode_mem, N_Vector v, N_Vector z)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* call Jacobian-times-vector product routine
     (either user-supplied or internal DQ) */
  retval = cvls_mem->jtimes(v, z, cv_mem->cv_tn, cvls_mem->ycur, cvls_mem->fcur,
                            cvls_mem->jt_data, cvls_mem->ytemp);
  cvls_mem->njtimes++;
  if (retval != 0) { return (retval); }

  /* add contribution from identity matrix */
  N_VLinearSum(ONE, v, -cv_mem->cv_gamma, z, z);

  return (0);
}